

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O0

void dill_pcompare(dill_stream_conflict s,int op_type,int data_type,dill_reg dest,dill_reg src1,
                  dill_reg src2)

{
  int iVar1;
  undefined4 in_ECX;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  int index;
  
  if ((in_ESI < 0) || (5 < in_ESI)) {
    printf("Bad op type in dill_pcompare\n");
  }
  iVar1 = in_EDX + in_ESI * 0xb;
  (**(code **)(*(long *)(*in_RDI + 0x90) + (long)iVar1 * 8))
            (in_RDI,(int)*(short *)(*(long *)(*in_RDI + 0xa0) + (long)iVar1 * 4),
             (int)*(short *)(*(long *)(*in_RDI + 0xa0) + 2 + (long)iVar1 * 4),in_ECX,in_R8D,in_R9D);
  return;
}

Assistant:

extern void
dill_pcompare(dill_stream s,
              int op_type,
              int data_type,
              dill_reg dest,
              dill_reg src1,
              dill_reg src2)
{
    int index;
    if ((op_type < dill_eq_code) || (op_type > dill_ne_code)) {
        printf("Bad op type in dill_pcompare\n");
    }
    index = data_type + 11 * op_type;
    (s->j->jmp_c)[index](s, s->j->c_data[index].data1,
                         s->j->c_data[index].data2, dest, src1, src2);
}